

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTestFilters(ConsoleReporter *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  string local_48;
  Colour local_11;
  ConsoleReporter *pCStack_10;
  Colour guard;
  ConsoleReporter *this_local;
  
  pCStack_10 = this;
  iVar2 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[0xd])();
  bVar1 = TestSpec::hasFilters((TestSpec *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    Colour::Colour(&local_11,BrightYellow);
    poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,"Filters: ");
    iVar2 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[0xf])();
    serializeFilters(&local_48,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var_00,iVar2));
    poVar3 = std::operator<<(poVar3,(string *)&local_48);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_48);
    Colour::~Colour(&local_11);
  }
  return;
}

Assistant:

void ConsoleReporter::printTestFilters() {
                if (m_config->testSpec().hasFilters()) {
                    Colour guard(Colour::BrightYellow);
                    stream << "Filters: " << serializeFilters(m_config->getTestsOrTags()) << '\n';
                }
            }